

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O2

void TestCRLReparse(Span<const_unsigned_char> der)

{
  OPENSSL_STACK *pOVar1;
  int iVar2;
  size_t sVar3;
  X509_CRL *pXVar4;
  X509_CRL *pXVar5;
  size_t sVar6;
  PKCS7 *__p;
  pointer *__ptr;
  uchar *puVar7;
  long *plVar8;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar9;
  char *pcVar10;
  char *in_R9;
  ulong uVar11;
  AssertionResult gtest_ar__3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  uint8_t *ptr;
  size_t local_e8;
  AssertionResult gtest_ar_;
  UniquePtr<uint8_t> free_result2_data;
  AssertHelper local_b8;
  UniquePtr<uint8_t> free_result_data;
  UniquePtr<struct_stack_st_X509_CRL> crls;
  UniquePtr<PKCS7> pkcs7_obj;
  CBS pkcs7;
  UniquePtr<struct_stack_st_X509_CRL> crls2;
  size_t result_len;
  uint8_t *result_data;
  ScopedCBB cbb;
  size_t result2_len;
  uint8_t *result2_data;
  
  sVar6 = der.size_;
  puVar7 = der.data_;
  crls._M_t.super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509_CRL,_bssl::internal::Deleter,_true,_true>)
       OPENSSL_sk_new_null();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<stack_st_X509_CRL_*,_bssl::internal::Deleter>)
       crls._M_t.super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl !=
       (_Head_base<0UL,_stack_st_X509_CRL_*,_false>)0x0;
  if ((tuple<stack_st_X509_CRL_*,_bssl::internal::Deleter>)
      crls._M_t.super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_CRL_*,_false>)0x0) {
    testing::Message::Message((Message *)&pkcs7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&cbb,(internal *)&gtest_ar_,(AssertionResult *)0x4d595e,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0xad,(char *)CONCAT71(cbb.ctx_.child._1_7_,(char)cbb.ctx_.child));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&pkcs7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&cbb);
    if (pkcs7.data != (uint8_t *)0x0) {
      (**(code **)(*(long *)pkcs7.data + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_002f6015;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  crls2._M_t.super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509_CRL,_bssl::internal::Deleter,_true,_true>)
       OPENSSL_sk_new_null();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<stack_st_X509_CRL_*,_bssl::internal::Deleter>)
       crls2._M_t.super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl !=
       (_Head_base<0UL,_stack_st_X509_CRL_*,_false>)0x0;
  if ((tuple<stack_st_X509_CRL_*,_bssl::internal::Deleter>)
      crls2._M_t.super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_CRL_*,_false>)0x0) {
    testing::Message::Message((Message *)&pkcs7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&cbb,(internal *)&gtest_ar_,(AssertionResult *)"crls2","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0xaf,(char *)CONCAT71(cbb.ctx_.child._1_7_,(char)cbb.ctx_.child));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&pkcs7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&cbb);
    plVar8 = (long *)pkcs7.data;
LAB_002f5901:
    if (plVar8 != (long *)0x0) {
      (**(code **)(*plVar8 + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pkcs7.data = puVar7;
    pkcs7.len = sVar6;
    iVar2 = PKCS7_get_CRLs((stack_st_X509_CRL *)
                           crls._M_t.
                           super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl,&pkcs7);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbb,(internal *)&gtest_ar_,
                 (AssertionResult *)"PKCS7_get_CRLs(crls.get(), &pkcs7)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ptr,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0xb4,(char *)CONCAT71(cbb.ctx_.child._1_7_,(char)cbb.ctx_.child));
      testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&gtest_ar__3);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
      std::__cxx11::string::~string((string *)&cbb);
      plVar8 = (long *)gtest_ar__3._0_8_;
      goto LAB_002f5901;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar__3._0_8_ = gtest_ar__3._0_8_ & 0xffffffff00000000;
    gtest_ar_._0_8_ = pkcs7.len;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&cbb,"0u","CBS_len(&pkcs7)",(uint *)&gtest_ar__3,
               (unsigned_long *)&gtest_ar_);
    if ((char)cbb.ctx_.child == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (cbb.ctx_._8_8_ == 0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = *(char **)cbb.ctx_._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0xb5,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cbb.ctx_.is_child);
    CBB_zero(&cbb.ctx_);
    iVar2 = CBB_init(&cbb.ctx_,sVar6);
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&ptr);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                 (AssertionResult *)"CBB_init(cbb.get(), der.size())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&free_result_data,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0xb8,(char *)gtest_ar_._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&free_result_data,(Message *)&ptr);
LAB_002f5bc1:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&free_result_data);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (ptr != (uint8_t *)0x0) {
        (**(code **)(*(long *)ptr + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__3.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__3.message_);
      iVar2 = PKCS7_bundle_CRLs(&cbb.ctx_,
                                (stack_st_X509_CRL *)
                                crls._M_t.
                                super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl);
      gtest_ar__3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__3.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&ptr);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                   (AssertionResult *)"PKCS7_bundle_CRLs(cbb.get(), crls.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&free_result_data,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xb9,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&free_result_data,(Message *)&ptr);
        goto LAB_002f5bc1;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__3.message_);
      iVar2 = CBB_finish(&cbb.ctx_,&result_data,&result_len);
      gtest_ar__3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__3.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&ptr);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                   (AssertionResult *)"CBB_finish(cbb.get(), &result_data, &result_len)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&free_result_data,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xba,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&free_result_data,(Message *)&ptr);
        goto LAB_002f5bc1;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__3.message_);
      free_result_data._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)result_data;
      pkcs7.data = result_data;
      pkcs7.len = result_len;
      iVar2 = PKCS7_get_CRLs((stack_st_X509_CRL *)
                             crls2._M_t.
                             super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl,&pkcs7);
      gtest_ar__3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__3.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&ptr);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                   (AssertionResult *)"PKCS7_get_CRLs(crls2.get(), &pkcs7)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&free_result2_data,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xbe,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&free_result2_data,(Message *)&ptr);
        goto LAB_002f5c4b;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__3.message_);
      ptr = (uint8_t *)((ulong)ptr & 0xffffffff00000000);
      gtest_ar__3._0_8_ = pkcs7.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar_,"0u","CBS_len(&pkcs7)",(uint *)&ptr,
                 (unsigned_long *)&gtest_ar__3);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__3);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ptr,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xbf,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&gtest_ar__3);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
        if (gtest_ar__3._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar__3._0_8_ =
           OPENSSL_sk_num((OPENSSL_STACK *)
                          crls._M_t.
                          super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl);
      ptr = (uint8_t *)
            OPENSSL_sk_num((OPENSSL_STACK *)
                           crls._M_t.
                           super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_,"sk_X509_CRL_num(crls.get())","sk_X509_CRL_num(crls.get())",
                 (unsigned_long *)&gtest_ar__3,(unsigned_long *)&ptr);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__3);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = *(char **)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ptr,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xc4,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&gtest_ar__3);
        puVar9 = &gtest_ar_.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
        if (gtest_ar__3._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
        }
LAB_002f5fec:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(puVar9);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        for (uVar11 = 0;
            sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)
                                   crls._M_t.
                                   super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl),
            uVar11 < sVar3; uVar11 = uVar11 + 1) {
          pXVar4 = (X509_CRL *)
                   OPENSSL_sk_value((OPENSSL_STACK *)
                                    crls._M_t.
                                    super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl,
                                    uVar11);
          pXVar5 = (X509_CRL *)
                   OPENSSL_sk_value((OPENSSL_STACK *)
                                    crls2._M_t.
                                    super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl,
                                    uVar11);
          gtest_ar__3._0_8_ = gtest_ar__3._0_8_ & 0xffffffff00000000;
          iVar2 = X509_CRL_cmp(pXVar4,pXVar5);
          ptr = (uint8_t *)CONCAT44(ptr._4_4_,iVar2);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar_,"0","X509_CRL_cmp(a, b)",(int *)&gtest_ar__3,(int *)&ptr
                    );
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__3);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&ptr,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,200,pcVar10);
            testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&gtest_ar__3)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
            if (gtest_ar__3._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
            }
            puVar9 = &gtest_ar_.message_;
            goto LAB_002f5fec;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        iVar2 = CBB_init(&cbb.ctx_,sVar6);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__3.success_ = iVar2 != 0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&ptr);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                     (AssertionResult *)"CBB_init(cbb.get(), der.size())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&free_result2_data,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,0xcb,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&free_result2_data,(Message *)&ptr);
LAB_002f5c4b:
          puVar9 = &gtest_ar__3.message_;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&free_result2_data);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if (ptr != (uint8_t *)0x0) {
            (**(code **)(*(long *)ptr + 8))();
          }
          goto LAB_002f5fec;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__3.message_);
        iVar2 = PKCS7_bundle_CRLs(&cbb.ctx_,
                                  (stack_st_X509_CRL *)
                                  crls2._M_t.
                                  super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__3.success_ = iVar2 != 0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&ptr);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                     (AssertionResult *)"PKCS7_bundle_CRLs(cbb.get(), crls2.get())","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&free_result2_data,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,0xcc,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&free_result2_data,(Message *)&ptr);
          goto LAB_002f5c4b;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__3.message_);
        iVar2 = CBB_finish(&cbb.ctx_,&result2_data,&result2_len);
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__3.success_ = iVar2 != 0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&ptr);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                     (AssertionResult *)"CBB_finish(cbb.get(), &result2_data, &result2_len)","false"
                     ,"true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&free_result2_data,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,0xcd,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&free_result2_data,(Message *)&ptr);
          goto LAB_002f5c4b;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__3.message_);
        free_result2_data._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)result2_data;
        gtest_ar__3._0_8_ = result_data;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )result_len;
        ptr = result2_data;
        local_e8 = result2_len;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)&gtest_ar_,"Bytes(result_data, result_len)",
                   "Bytes(result2_data, result2_len)",(Bytes *)&gtest_ar__3,(Bytes *)&ptr);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__3);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&ptr,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,0xd0,pcVar10);
          testing::internal::AssertHelper::operator=((AssertHelper *)&ptr,(Message *)&gtest_ar__3);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ptr);
          if (gtest_ar__3._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ptr = puVar7;
        pkcs7_obj._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl =
             (__uniq_ptr_data<PKCS7,_bssl::internal::Deleter,_true,_true>)
             d2i_PKCS7((PKCS7 **)0x0,&ptr,sVar6);
        puVar9 = &gtest_ar__3.message_;
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__3.success_ =
             (tuple<PKCS7_*,_bssl::internal::Deleter>)
             pkcs7_obj._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl !=
             (_Head_base<0UL,_PKCS7_*,_false>)0x0;
        if ((tuple<PKCS7_*,_bssl::internal::Deleter>)
            pkcs7_obj._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl ==
            (_Head_base<0UL,_PKCS7_*,_false>)0x0) {
          testing::Message::Message((Message *)&local_f8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_,(internal *)&gtest_ar__3,(AssertionResult *)"pkcs7_obj",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,0xd5,(char *)gtest_ar_._0_8_);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f8);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if (local_f8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_f8._M_head_impl + 8))();
          }
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(puVar9);
          gtest_ar__3._0_8_ = puVar7 + sVar6;
          testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char_const*>
                    ((internal *)&gtest_ar_,"ptr","der.data() + der.size()",&ptr,
                     (uchar **)&gtest_ar__3);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__3);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,0xd6,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_f8,(Message *)&gtest_ar__3);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
            if (gtest_ar__3._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          iVar2 = PKCS7_type_is_signed
                            ((PKCS7 *)pkcs7_obj._M_t.
                                      super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl);
          gtest_ar__3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__3.success_ = iVar2 != 0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                       (AssertionResult *)"PKCS7_type_is_signed(pkcs7_obj.get())","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,0xd8,(char *)gtest_ar_._0_8_);
            testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f8);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__3.message_);
            pOVar1 = *(OPENSSL_STACK **)
                      (*(long *)((long)pkcs7_obj._M_t.
                                       super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl + 0x18) +
                      8);
            gtest_ar__3._0_8_ =
                 OPENSSL_sk_num((OPENSSL_STACK *)
                                crls._M_t.
                                super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>.
                                _M_t.
                                super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl);
            local_f8._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 OPENSSL_sk_num(pOVar1);
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&gtest_ar_,"sk_X509_CRL_num(crls.get())","sk_X509_CRL_num(crls3)"
                       ,(unsigned_long *)&gtest_ar__3,(unsigned_long *)&local_f8);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar__3);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar10 = "";
              }
              else {
                pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                         ,0xda,pcVar10);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_f8,(Message *)&gtest_ar__3);
LAB_002f6536:
              puVar9 = &gtest_ar_.message_;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
              if (gtest_ar__3._0_8_ != 0) {
                (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
              }
              goto LAB_002f6605;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            for (uVar11 = 0;
                sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)
                                       crls._M_t.
                                       super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>.
                                       _M_head_impl), uVar11 < sVar6; uVar11 = uVar11 + 1) {
              pXVar4 = (X509_CRL *)
                       OPENSSL_sk_value((OPENSSL_STACK *)
                                        crls._M_t.
                                        super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>.
                                        _M_head_impl,uVar11);
              pXVar5 = (X509_CRL *)OPENSSL_sk_value(pOVar1,uVar11);
              gtest_ar__3._0_8_ = gtest_ar__3._0_8_ & 0xffffffff00000000;
              iVar2 = X509_CRL_cmp(pXVar4,pXVar5);
              local_f8._M_head_impl._0_4_ = iVar2;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar_,"0","X509_CRL_cmp(a, b)",(int *)&gtest_ar__3,
                         (int *)&local_f8);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__3);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0xde,pcVar10);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_f8,(Message *)&gtest_ar__3);
                goto LAB_002f65e7;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
            }
            ptr = result_data;
            __p = d2i_PKCS7((PKCS7 **)0x0,&ptr,result_len);
            std::__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter> *)&pkcs7_obj,(pointer)__p);
            gtest_ar__3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__3.success_ =
                 (__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>)
                 pkcs7_obj._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>)
                pkcs7_obj._M_t.super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&local_f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                         (AssertionResult *)"pkcs7_obj","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                         ,0xe3,(char *)gtest_ar_._0_8_);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f8);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__3.message_);
              gtest_ar__3._0_8_ = result_data + result_len;
              testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
                        ((internal *)&gtest_ar_,"ptr","result_data + result_len",&ptr,
                         (uchar **)&gtest_ar__3);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__3);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_f8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0xe4,pcVar10);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_f8,(Message *)&gtest_ar__3);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
                if (gtest_ar__3._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              iVar2 = PKCS7_type_is_signed
                                ((PKCS7 *)pkcs7_obj._M_t.
                                          super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>._M_t
                                          .super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                                          super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl);
              gtest_ar__3.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__3.success_ = iVar2 != 0;
              if (iVar2 != 0) {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__3.message_);
                pOVar1 = *(OPENSSL_STACK **)
                          (*(long *)((long)pkcs7_obj._M_t.
                                           super___uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_PKCS7_*,_bssl::internal::Deleter>.
                                           super__Head_base<0UL,_PKCS7_*,_false>._M_head_impl + 0x18
                                    ) + 8);
                gtest_ar__3._0_8_ =
                     OPENSSL_sk_num((OPENSSL_STACK *)
                                    crls._M_t.
                                    super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>._M_head_impl)
                ;
                local_f8._M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     OPENSSL_sk_num(pOVar1);
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)&gtest_ar_,"sk_X509_CRL_num(crls.get())",
                           "sk_X509_CRL_num(crls4)",(unsigned_long *)&gtest_ar__3,
                           (unsigned_long *)&local_f8);
                if (gtest_ar_.success_ != false) {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  uVar11 = 0;
LAB_002f6706:
                  sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)
                                         crls._M_t.
                                         super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>.
                                         _M_head_impl);
                  if (uVar11 < sVar6) {
                    pXVar4 = (X509_CRL *)
                             OPENSSL_sk_value((OPENSSL_STACK *)
                                              crls._M_t.
                                              super___uniq_ptr_impl<stack_st_X509_CRL,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_stack_st_X509_CRL_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_stack_st_X509_CRL_*,_false>.
                                              _M_head_impl,uVar11);
                    pXVar5 = (X509_CRL *)OPENSSL_sk_value(pOVar1,uVar11);
                    gtest_ar__3._0_8_ = gtest_ar__3._0_8_ & 0xffffffff00000000;
                    iVar2 = X509_CRL_cmp(pXVar4,pXVar5);
                    local_f8._M_head_impl._0_4_ = iVar2;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar_,"0","X509_CRL_cmp(a, b)",(int *)&gtest_ar__3,
                               (int *)&local_f8);
                    if (gtest_ar_.success_ != false) goto code_r0x002f676e;
                    testing::Message::Message((Message *)&gtest_ar__3);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar10 = "";
                    }
                    else {
                      pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0xec,pcVar10);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_f8,(Message *)&gtest_ar__3);
LAB_002f65e7:
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
                    if (gtest_ar__3._0_8_ != 0) {
                      (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
                    }
                    puVar9 = &gtest_ar_.message_;
                    goto LAB_002f6605;
                  }
                  goto LAB_002f660a;
                }
                testing::Message::Message((Message *)&gtest_ar__3);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = *(char **)gtest_ar_.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0xe8,pcVar10);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_f8,(Message *)&gtest_ar__3);
                goto LAB_002f6536;
              }
              testing::Message::Message((Message *)&local_f8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                         (AssertionResult *)"PKCS7_type_is_signed(pkcs7_obj.get())","false","true",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                         ,0xe6,(char *)gtest_ar_._0_8_);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f8);
            }
          }
          puVar9 = &gtest_ar__3.message_;
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          std::__cxx11::string::~string((string *)&gtest_ar_);
          if (local_f8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_f8._M_head_impl + 8))();
          }
        }
LAB_002f6605:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(puVar9);
LAB_002f660a:
        std::unique_ptr<PKCS7,_bssl::internal::Deleter>::~unique_ptr(&pkcs7_obj);
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_result2_data);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_result_data);
    }
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  }
  std::unique_ptr<stack_st_X509_CRL,_bssl::internal::Deleter>::~unique_ptr(&crls2);
LAB_002f6015:
  std::unique_ptr<stack_st_X509_CRL,_bssl::internal::Deleter>::~unique_ptr(&crls);
  return;
code_r0x002f676e:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  uVar11 = uVar11 + 1;
  goto LAB_002f6706;
}

Assistant:

static void TestCRLReparse(bssl::Span<const uint8_t> der) {
  bssl::UniquePtr<STACK_OF(X509_CRL)> crls(sk_X509_CRL_new_null());
  ASSERT_TRUE(crls);
  bssl::UniquePtr<STACK_OF(X509_CRL)> crls2(sk_X509_CRL_new_null());
  ASSERT_TRUE(crls2);
  uint8_t *result_data, *result2_data;
  size_t result_len, result2_len;

  CBS pkcs7 = der;
  ASSERT_TRUE(PKCS7_get_CRLs(crls.get(), &pkcs7));
  EXPECT_EQ(0u, CBS_len(&pkcs7));

  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), der.size()));
  ASSERT_TRUE(PKCS7_bundle_CRLs(cbb.get(), crls.get()));
  ASSERT_TRUE(CBB_finish(cbb.get(), &result_data, &result_len));
  bssl::UniquePtr<uint8_t> free_result_data(result_data);

  CBS_init(&pkcs7, result_data, result_len);
  ASSERT_TRUE(PKCS7_get_CRLs(crls2.get(), &pkcs7));
  EXPECT_EQ(0u, CBS_len(&pkcs7));

  // PKCS#7 stores CRLs in a SET OF, so |PKCS7_bundle_CRLs| may not preserve the
  // original order. All of our test inputs are already sorted, but this check
  // should be relaxed if we add others.
  ASSERT_EQ(sk_X509_CRL_num(crls.get()), sk_X509_CRL_num(crls.get()));
  for (size_t i = 0; i < sk_X509_CRL_num(crls.get()); i++) {
    X509_CRL *a = sk_X509_CRL_value(crls.get(), i);
    X509_CRL *b = sk_X509_CRL_value(crls2.get(), i);
    ASSERT_EQ(0, X509_CRL_cmp(a, b));
  }

  ASSERT_TRUE(CBB_init(cbb.get(), der.size()));
  ASSERT_TRUE(PKCS7_bundle_CRLs(cbb.get(), crls2.get()));
  ASSERT_TRUE(CBB_finish(cbb.get(), &result2_data, &result2_len));
  bssl::UniquePtr<uint8_t> free_result2_data(result2_data);

  EXPECT_EQ(Bytes(result_data, result_len), Bytes(result2_data, result2_len));

  // Parse with the legacy API instead.
  const uint8_t *ptr = der.data();
  bssl::UniquePtr<PKCS7> pkcs7_obj(d2i_PKCS7(nullptr, &ptr, der.size()));
  ASSERT_TRUE(pkcs7_obj);
  EXPECT_EQ(ptr, der.data() + der.size());

  ASSERT_TRUE(PKCS7_type_is_signed(pkcs7_obj.get()));
  const STACK_OF(X509_CRL) *crls3 = pkcs7_obj->d.sign->crl;
  ASSERT_EQ(sk_X509_CRL_num(crls.get()), sk_X509_CRL_num(crls3));
  for (size_t i = 0; i < sk_X509_CRL_num(crls.get()); i++) {
    X509_CRL *a = sk_X509_CRL_value(crls.get(), i);
    X509_CRL *b = sk_X509_CRL_value(crls3, i);
    ASSERT_EQ(0, X509_CRL_cmp(a, b));
  }

  ptr = result_data;
  pkcs7_obj.reset(d2i_PKCS7(nullptr, &ptr, result_len));
  ASSERT_TRUE(pkcs7_obj);
  EXPECT_EQ(ptr, result_data + result_len);

  ASSERT_TRUE(PKCS7_type_is_signed(pkcs7_obj.get()));
  const STACK_OF(X509_CRL) *crls4 = pkcs7_obj->d.sign->crl;
  ASSERT_EQ(sk_X509_CRL_num(crls.get()), sk_X509_CRL_num(crls4));
  for (size_t i = 0; i < sk_X509_CRL_num(crls.get()); i++) {
    X509_CRL *a = sk_X509_CRL_value(crls.get(), i);
    X509_CRL *b = sk_X509_CRL_value(crls4, i);
    ASSERT_EQ(0, X509_CRL_cmp(a, b));
  }
}